

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int grad_cd(custom_function *funcpt,custom_gradient *funcgrad,double *x,int N,double *dx,double eps3
           ,double *f)

{
  int iVar1;
  
  if (funcgrad != (custom_gradient *)0x0) {
    (*funcgrad->funcgrad)(x,N,f,funcgrad->params);
    return 0;
  }
  iVar1 = grad_calc2(funcpt,x,N,dx,eps3,f);
  return iVar1;
}

Assistant:

int grad_cd(custom_function *funcpt, custom_gradient *funcgrad, double *x, int N, double *dx,
		double eps3, double *f) {
	int retval;
	retval = 0;
	if (funcgrad == NULL) {
		//printf("FD Gradient \n");
		retval = grad_calc2(funcpt,x,N,dx,eps3,f);
	} else {
		//printf("Analytic gradient \n");
		FUNCGRAD_EVAL(funcgrad,x,N,f);
	}
	return retval;

}